

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# performance.cpp
# Opt level: O0

void error_handler_new(exr_const_context_t file,int code,char *msg)

{
  ostream *poVar1;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  char *fn;
  char *local_20;
  char *local_18;
  int local_c;
  long local_8;
  
  local_18 = in_RDX;
  local_c = in_ESI;
  local_8 = in_RDI;
  exr_get_file_name(in_RDI,&local_20);
  std::operator<<((ostream *)&std::cerr,"Core EXR ERROR:");
  if (local_8 != 0) {
    poVar1 = std::operator<<((ostream *)&std::cerr," \'");
    poVar1 = std::operator<<(poVar1,local_20);
    std::operator<<(poVar1,"\'");
  }
  poVar1 = std::operator<<((ostream *)&std::cerr," (");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_c);
  poVar1 = std::operator<<(poVar1,"): ");
  poVar1 = std::operator<<(poVar1,local_18);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

static void
error_handler_new (exr_const_context_t file, int code, const char* msg)
{
    const char* fn;
    exr_get_file_name (file, &fn);
    std::cerr << "Core EXR ERROR:";
    if (file) std::cerr << " '" << fn << "'";
    std::cerr << " (" << code << "): " << msg << std::endl;
}